

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hfe.cpp
# Opt level: O3

bool WriteHFE(FILE *f_,shared_ptr<Disk> *disk)

{
  element_type *peVar1;
  pointer puVar2;
  pointer puVar3;
  pointer piVar4;
  pointer piVar5;
  bool bVar6;
  uint8_t uVar7;
  int iVar8;
  DataRate DVar9;
  int iVar10;
  int iVar11;
  undefined8 *__s;
  Track *this;
  Sector *pSVar12;
  size_t sVar13;
  undefined4 extraout_var;
  BitBuffer *pBVar14;
  mapped_type *pmVar15;
  uint8_t *__ptr;
  exception *peVar16;
  byte bVar17;
  Encoding EVar18;
  undefined1 uVar19;
  undefined1 uVar20;
  uint uVar21;
  ulong __n;
  uint uVar22;
  uint8_t *puVar23;
  byte bVar24;
  undefined2 uVar25;
  uint uVar26;
  ulong uVar27;
  long lVar28;
  undefined1 uVar29;
  long lVar30;
  CylHead cylhead;
  BitBuffer bitstream;
  map<CylHead,_BitBuffer,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_BitBuffer>_>_>
  bitstreams;
  TrackData trackdata;
  array<HFE_TRACK,_128UL> aTrackLUT;
  ulong local_468;
  CylHead local_440;
  BitBuffer local_438;
  _Rb_tree<CylHead,_std::pair<const_CylHead,_BitBuffer>,_std::_Select1st<std::pair<const_CylHead,_BitBuffer>_>,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_BitBuffer>_>_>
  local_3d0;
  TrackData local_3a0;
  TrackData local_2e8;
  CylHead local_230 [64];
  
  __s = (undefined8 *)operator_new(0x100);
  memset(__s,0xff,0x100);
  local_230[0].cyl = 0;
  local_230[0].head = 0;
  this = Disk::read_track((disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                          local_230,false);
  *__s = 0x4546434950435848;
  *(undefined1 *)(__s + 1) = 0;
  iVar8 = Disk::cyls((disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  *(char *)((long)__s + 9) = (char)iVar8;
  iVar8 = Disk::heads((disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
  *(char *)((long)__s + 10) = (char)iVar8;
  EVar18 = opt.encoding;
  if (opt.encoding == Unknown) {
    bVar6 = Track::empty(this);
    uVar19 = 0xff;
    if (!bVar6) {
      pSVar12 = Track::operator[](this,0);
      EVar18 = pSVar12->encoding;
      goto LAB_00192765;
    }
  }
  else {
LAB_00192765:
    uVar19 = 0xff;
    if (EVar18 - MFM < 8) {
      uVar19 = (undefined1)(0xffff01000200 >> ((char)(EVar18 - MFM) * '\b' & 0x3fU));
    }
  }
  *(undefined1 *)((long)__s + 0xb) = uVar19;
  DVar9 = opt.datarate;
  if (opt.datarate == Unknown) {
    bVar6 = Track::empty(this);
    uVar25 = 0xfa;
    if (!bVar6) {
      pSVar12 = Track::operator[](this,0);
      DVar9 = pSVar12->datarate;
      if (DVar9 != Unknown) goto LAB_00192790;
    }
  }
  else {
LAB_00192790:
    uVar25 = (undefined2)((ulong)DVar9 / 1000);
  }
  *(undefined2 *)((long)__s + 0xc) = uVar25;
  *(undefined2 *)((long)__s + 0xe) = 0;
  bVar6 = Track::empty(this);
  uVar19 = 7;
  if (!bVar6) {
    pSVar12 = Track::operator[](this,0);
    if (pSVar12->encoding - MFM < 2) {
      uVar19 = 8;
      DVar9 = _1M;
      uVar29 = 1;
    }
    else {
      if (pSVar12->encoding != Amiga) goto LAB_0019283b;
      uVar19 = 4;
      DVar9 = _250K;
      uVar29 = 5;
    }
    pSVar12 = Track::operator[](this,0);
    uVar20 = 7;
    if (pSVar12->datarate == _500K) {
      uVar20 = uVar29;
    }
    if (pSVar12->datarate != DVar9) {
      uVar19 = uVar20;
    }
  }
LAB_0019283b:
  *(undefined1 *)(__s + 2) = uVar19;
  *(undefined1 *)((long)__s + 0x11) = 1;
  *(undefined2 *)((long)__s + 0x12) = 1;
  *(undefined4 *)((long)__s + 0x14) = 0xffffffff;
  *(undefined2 *)(__s + 3) = 0xffff;
  sVar13 = fwrite(__s,0x100,1,(FILE *)f_);
  if (sVar13 == 0) {
    peVar16 = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[12]>(peVar16,(char (*) [12])"write error");
  }
  else {
    iVar8 = fseek((FILE *)f_,(ulong)*(ushort *)((long)__s + 0x12) << 9,0);
    if (iVar8 == 0) {
      memset(local_230,0,0x200);
      local_3d0._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_3d0._M_impl.super__Rb_tree_header._M_header;
      local_3d0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_3d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_468 = 0;
      local_3d0._M_impl.super__Rb_tree_header._M_node_count = 0;
      bVar24 = *(byte *)((long)__s + 9);
      local_3d0._M_impl.super__Rb_tree_header._M_header._M_right =
           local_3d0._M_impl.super__Rb_tree_header._M_header._M_left;
      if (bVar24 == 0) {
        iVar8 = 0x200;
      }
      else {
        bVar17 = *(byte *)((long)__s + 10);
        iVar8 = 2;
        uVar22 = 0;
        do {
          if (bVar17 == 0) {
            bVar17 = 0;
            uVar26 = 0;
          }
          else {
            uVar21 = 0;
            uVar26 = 0;
            do {
              CylHead::CylHead(&local_440,(int)local_468,uVar21);
              peVar1 = (disk->super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
              iVar10 = (*peVar1->_vptr_Disk[4])(peVar1,&local_440,0);
              TrackData::TrackData(&local_3a0,(TrackData *)CONCAT44(extraout_var,iVar10));
              TrackData::preferred(&local_2e8,&local_3a0);
              pBVar14 = TrackData::bitstream(&local_2e8);
              local_438.datarate = pBVar14->datarate;
              local_438.encoding = pBVar14->encoding;
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
                        (&local_438.m_data,&pBVar14->m_data);
              std::vector<int,_std::allocator<int>_>::vector
                        (&local_438.m_indexes,&pBVar14->m_indexes);
              std::vector<int,_std::allocator<int>_>::vector
                        (&local_438.m_sync_losses,&pBVar14->m_sync_losses);
              local_438.m_wrapped = pBVar14->m_wrapped;
              local_438.m_bitsize = pBVar14->m_bitsize;
              local_438.m_bitpos = pBVar14->m_bitpos;
              local_438.m_splicepos = pBVar14->m_splicepos;
              local_438.m_next_index = pBVar14->m_next_index;
              std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::~vector(&local_2e8.m_flux);
              if (local_2e8.m_bitstream.m_sync_losses.super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_2e8.m_bitstream.m_sync_losses.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_2e8.m_bitstream.m_sync_losses.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage -
                                (long)local_2e8.m_bitstream.m_sync_losses.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start);
              }
              if (local_2e8.m_bitstream.m_indexes.super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_2e8.m_bitstream.m_indexes.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_2e8.m_bitstream.m_indexes.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage -
                                (long)local_2e8.m_bitstream.m_indexes.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start);
              }
              if (local_2e8.m_bitstream.m_data.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_2e8.m_bitstream.m_data.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_2e8.m_bitstream.m_data.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_2e8.m_bitstream.m_data.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              std::vector<Sector,_std::allocator<Sector>_>::~vector(&local_2e8.m_track.m_sectors);
              iVar11 = BitBuffer::track_bitsize(&local_438);
              iVar10 = iVar11 + 0xe;
              if (-1 < iVar11 + 7) {
                iVar10 = iVar11 + 7;
              }
              if ((int)uVar26 < iVar10 >> 3) {
                uVar26 = iVar10 >> 3;
              }
              if ((int)uVar22 <= (int)uVar26) {
                uVar22 = uVar26;
              }
              pmVar15 = std::
                        map<CylHead,_BitBuffer,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_BitBuffer>_>_>
                        ::operator[]((map<CylHead,_BitBuffer,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_BitBuffer>_>_>
                                      *)&local_3d0,&local_440);
              pmVar15->datarate = local_438.datarate;
              pmVar15->encoding = local_438.encoding;
              puVar2 = (pmVar15->m_data).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start;
              puVar3 = (pmVar15->m_data).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
              (pmVar15->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start =
                   local_438.m_data.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
              (pmVar15->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish =
                   local_438.m_data.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              (pmVar15->m_data).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage =
                   local_438.m_data.
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
              local_438.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              local_438.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              local_438.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              if (puVar2 != (pointer)0x0) {
                operator_delete(puVar2,(long)puVar3 - (long)puVar2);
              }
              piVar4 = (pmVar15->m_indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              piVar5 = (pmVar15->m_indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage;
              (pmVar15->m_indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start =
                   local_438.m_indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
              (pmVar15->m_indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_438.m_indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              (pmVar15->m_indexes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   local_438.m_indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
              local_438.m_indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_438.m_indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_438.m_indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              if (piVar4 != (pointer)0x0) {
                operator_delete(piVar4,(long)piVar5 - (long)piVar4);
              }
              piVar4 = (pmVar15->m_sync_losses).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start;
              piVar5 = (pmVar15->m_sync_losses).super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage;
              (pmVar15->m_sync_losses).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start =
                   local_438.m_sync_losses.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
              (pmVar15->m_sync_losses).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_438.m_sync_losses.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              (pmVar15->m_sync_losses).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage =
                   local_438.m_sync_losses.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
              local_438.m_sync_losses.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start = (pointer)0x0;
              local_438.m_sync_losses.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish = (pointer)0x0;
              local_438.m_sync_losses.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              if (piVar4 == (pointer)0x0) {
                pmVar15->m_wrapped = local_438.m_wrapped;
                pmVar15->m_bitsize = local_438.m_bitsize;
                pmVar15->m_bitpos = local_438.m_bitpos;
                pmVar15->m_splicepos = local_438.m_splicepos;
                pmVar15->m_next_index = local_438.m_next_index;
              }
              else {
                operator_delete(piVar4,(long)piVar5 - (long)piVar4);
                pmVar15->m_wrapped = local_438.m_wrapped;
                pmVar15->m_bitsize = local_438.m_bitsize;
                pmVar15->m_bitpos = local_438.m_bitpos;
                pmVar15->m_splicepos = local_438.m_splicepos;
                pmVar15->m_next_index = local_438.m_next_index;
                if (local_438.m_sync_losses.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_438.m_sync_losses.
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (long)local_438.m_sync_losses.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_end_of_storage -
                                  (long)local_438.m_sync_losses.
                                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                        super__Vector_impl_data._M_start);
                }
              }
              if (local_438.m_indexes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_438.m_indexes.super__Vector_base<int,_std::allocator<int>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_438.m_indexes.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage -
                                (long)local_438.m_indexes.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start);
              }
              if (local_438.m_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                  ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_438.m_data.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_438.m_data.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_438.m_data.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              std::
              vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              ::~vector(&local_3a0.m_flux);
              if (local_3a0.m_bitstream.m_sync_losses.super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_3a0.m_bitstream.m_sync_losses.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_3a0.m_bitstream.m_sync_losses.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage -
                                (long)local_3a0.m_bitstream.m_sync_losses.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start);
              }
              if (local_3a0.m_bitstream.m_indexes.super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_3a0.m_bitstream.m_indexes.
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start,
                                (long)local_3a0.m_bitstream.m_indexes.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_end_of_storage -
                                (long)local_3a0.m_bitstream.m_indexes.
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data._M_start);
              }
              if (local_3a0.m_bitstream.m_data.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start != (pointer)0x0) {
                operator_delete(local_3a0.m_bitstream.m_data.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start,
                                (long)local_3a0.m_bitstream.m_data.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                (long)local_3a0.m_bitstream.m_data.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
              }
              std::vector<Sector,_std::allocator<Sector>_>::~vector(&local_3a0.m_track.m_sectors);
              uVar21 = uVar21 + 1;
              bVar17 = *(byte *)((long)__s + 10);
            } while (uVar21 < bVar17);
            bVar24 = *(byte *)((long)__s + 9);
          }
          *(short *)(&local_230[0].cyl + local_468) = (short)iVar8;
          *(short *)((long)&local_230[0].cyl + local_468 * 4 + 2) = (short)uVar26 * 2;
          iVar8 = iVar8 + (uVar26 >> 8) + 1;
          local_468 = local_468 + 1;
        } while (local_468 < bVar24);
        iVar8 = uVar22 * 2 + 0x200;
      }
      sVar13 = fwrite(local_230,4,0x80,(FILE *)f_);
      if (sVar13 == 0x80) {
        __ptr = AllocMem(iVar8);
        if (*(char *)((long)__s + 9) != '\0') {
          uVar27 = 0;
          do {
            if (*(char *)((long)__s + 10) != '\0') {
              lVar30 = 0;
              do {
                CylHead::CylHead(&local_3a0.cylhead,(int)uVar27,(int)lVar30);
                pmVar15 = std::
                          map<CylHead,_BitBuffer,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_BitBuffer>_>_>
                          ::operator[]((map<CylHead,_BitBuffer,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_BitBuffer>_>_>
                                        *)&local_3d0,&local_3a0.cylhead);
                iVar8 = BitBuffer::track_bitsize(pmVar15);
                BitBuffer::seek(pmVar15,0);
                if (0 < iVar8) {
                  puVar23 = __ptr + lVar30 * 0x100;
                  uVar22 = iVar8 + 7U >> 3;
                  do {
                    uVar26 = uVar22;
                    if (0xff < uVar22) {
                      uVar26 = 0x100;
                    }
                    lVar28 = 0;
                    do {
                      uVar7 = BitBuffer::read8_lsb(pmVar15);
                      puVar23[lVar28] = uVar7;
                      lVar28 = lVar28 + 1;
                    } while (uVar26 != (uint)lVar28);
                    memset(puVar23 + lVar28,0x55,(ulong)(0x100 - uVar26));
                    puVar23 = puVar23 + lVar28 + (0x200 - uVar26);
                    uVar21 = uVar22 - uVar26;
                    bVar6 = (int)uVar26 <= (int)uVar22;
                    uVar22 = uVar21;
                  } while (uVar21 != 0 && bVar6);
                }
                lVar30 = lVar30 + 1;
              } while ((uint)lVar30 < (uint)*(byte *)((long)__s + 10));
            }
            fseek((FILE *)f_,(ulong)(ushort)(&local_230[0].cyl)[uVar27] << 9,0);
            __n = (ulong)(*(ushort *)((long)&local_230[0].cyl + uVar27 * 4 + 2) + 0x1ff & 0x1fe00);
            sVar13 = fwrite(__ptr,1,__n,(FILE *)f_);
            if (sVar13 != __n) {
              peVar16 = (exception *)__cxa_allocate_exception(0x10);
              util::exception::exception<char_const(&)[12]>(peVar16,(char (*) [12])"write error");
              __cxa_throw(peVar16,&util::exception::typeinfo,std::runtime_error::~runtime_error);
            }
            bVar24 = (char)uVar27 + 1;
            uVar27 = (ulong)bVar24;
          } while (bVar24 < *(byte *)((long)__s + 9));
        }
        FreeMem(__ptr);
        std::
        _Rb_tree<CylHead,_std::pair<const_CylHead,_BitBuffer>,_std::_Select1st<std::pair<const_CylHead,_BitBuffer>_>,_std::less<CylHead>,_std::allocator<std::pair<const_CylHead,_BitBuffer>_>_>
        ::~_Rb_tree(&local_3d0);
        operator_delete(__s,0x100);
        return true;
      }
      peVar16 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[12]>(peVar16,(char (*) [12])"write error");
      __cxa_throw(peVar16,&util::exception::typeinfo,std::runtime_error::~runtime_error);
    }
    peVar16 = (exception *)__cxa_allocate_exception(0x10);
    util::exception::exception<char_const(&)[11]>(peVar16,(char (*) [11])"seek error");
  }
  __cxa_throw(peVar16,&util::exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

bool WriteHFE(FILE* f_, std::shared_ptr<Disk>& disk)
{
    std::vector<uint8_t> header(256, 0xff);
    auto& hh = *reinterpret_cast<HFE_HEADER*>(header.data());

    auto& track0 = disk->read_track({ 0, 0 });

    strncpy(hh.header_signature, HFE_SIGNATURE, sizeof(hh.header_signature));
    hh.format_revision = 0x00;
    hh.number_of_tracks = static_cast<uint8_t>(disk->cyls());
    hh.number_of_sides = static_cast<uint8_t>(disk->heads());
    hh.track_encoding = HfeTrackEncoding(track0);
    hh.bitrate_kbps = util::htole(HfeDataRate(track0));
    hh.floppy_rpm = 0;
    hh.floppy_interface_mode = HfeInterfaceMode(track0);
    hh.do_not_use = 0x01;
    hh.track_list_offset = util::htole(static_cast<uint16_t>(0x200 >> 9));
    hh.write_allowed = 0xff;
    hh.single_step = 0xff;
    hh.track0s0_altencoding = 0xff;
    hh.track0s0_encoding = 0xff;
    hh.track0s1_altencoding = 0xff;
    hh.track0s1_encoding = 0xff;

    if (!fwrite(header.data(), header.size(), 1, f_))
        throw util::exception("write error");
    if (fseek(f_, hh.track_list_offset << 9, SEEK_SET))
        throw util::exception("seek error");

    std::array<HFE_TRACK, MAX_TRACKS> aTrackLUT{};
    std::map<CylHead, BitBuffer> bitstreams;
    int data_offset = 2;

    auto max_disk_track_bytes = 0;
    for (uint8_t cyl = 0; cyl < hh.number_of_tracks; ++cyl)
    {
        auto max_track_bytes = 0;
        for (uint8_t head = 0; head < hh.number_of_sides; ++head)
        {
            CylHead cylhead(cyl, head);
            auto trackdata = disk->read(cylhead);
            auto bitstream = trackdata.preferred().bitstream();
            auto track_bytes = (bitstream.track_bitsize() + 7) / 8;
            max_track_bytes = std::max(track_bytes, max_track_bytes);
            max_disk_track_bytes = std::max(max_disk_track_bytes, max_track_bytes);
            bitstreams[cylhead] = std::move(bitstream);
        }

        aTrackLUT[cyl].offset = util::htole(static_cast<uint16_t>(data_offset));
        aTrackLUT[cyl].track_len = util::htole(static_cast<uint16_t>(max_track_bytes * 2));

        data_offset += ((max_track_bytes * 2) / 512) + 1;
    }

    if (fwrite(aTrackLUT.data(), sizeof(aTrackLUT[0]), aTrackLUT.size(), f_) != aTrackLUT.size())
        throw util::exception("write error");

    MEMORY mem(max_disk_track_bytes * 2 + 512);
    for (uint8_t cyl = 0; cyl < hh.number_of_tracks; ++cyl)
    {
        uint8_t* pbTrack{};
        for (uint8_t head = 0; head < hh.number_of_sides; ++head)
        {
            auto& bitstream = bitstreams[{ cyl, head }];
            auto track_bytes = (bitstream.track_bitsize() + 7) / 8;
            bitstream.seek(0);

            pbTrack = mem.pb + head * 256;
            while (track_bytes > 0)
            {
                auto chunk_size = std::min(track_bytes, 0x100);
                for (int i = 0; i < chunk_size; ++i)
                    *pbTrack++ = bitstream.read8_lsb();
                memset(pbTrack, 0x55, 0x100 - chunk_size);
                pbTrack += 0x200 - chunk_size;
                track_bytes -= chunk_size;
            }
        }

        fseek(f_, util::letoh(aTrackLUT[cyl].offset) * 512, SEEK_SET);
        auto track_len = (util::letoh(aTrackLUT[cyl].track_len) + 511) & ~0x1ff;
        if (fwrite(mem.pb, 1, track_len, f_) != static_cast<size_t>(track_len))
            throw util::exception("write error");
    }

    return true;
}